

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O2

void possibleMovesBPawns(move lastMove,bitboards game,extraBitboardsInfo info,
                        arrayMoveList *possibleMoves)

{
  long lVar1;
  byte bVar2;
  byte j;
  byte bVar3;
  ulong uVar4;
  uint3 uVar5;
  ulong uVar6;
  ulong uVar7;
  uint local_48;
  
  uVar7 = info.WhitePieces;
  uVar6 = info.BlackPieces | uVar7;
  uVar4 = ~uVar6 & game.BP >> 8;
  constantShiftGenerator(uVar4 & 0xffffffffffffff00,-8,possibleMoves);
  constantShiftGenerator(~(uVar6 >> 8 | uVar6) & 0xff00000000 & game.BP >> 0x10,-0x10,possibleMoves)
  ;
  constantShiftGenerator(uVar7 & 0x7f7f7f7f7f7f00 & game.BP >> 9,-9,possibleMoves);
  constantShiftGenerator(uVar7 & 0xfefefefefefe00 & game.BP >> 7,-7,possibleMoves);
  for (uVar4 = uVar4 & 0xff; uVar4 != 0; uVar4 = uVar4 & uVar4 - 1) {
    lVar1 = 0;
    if (uVar4 != 0) {
      for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    for (bVar3 = '\x06'; bVar3 != '\n'; bVar3 = bVar3 + '\x01') {
      arrayMoveList::create(possibleMoves,'7' - (byte)lVar1,(byte)lVar1 ^ 0x3f,bVar3);
    }
  }
  local_48 = (uint)info.WhitePieces;
  for (uVar7 = (ulong)((uint)(game.BP >> 7) & local_48 & ~(uint)info.BlackPieces & 0xfe); uVar7 != 0
      ; uVar7 = uVar7 & uVar7 - 1) {
    lVar1 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    for (bVar3 = '\x06'; bVar3 != '\n'; bVar3 = bVar3 + '\x01') {
      arrayMoveList::create(possibleMoves,'8' - (byte)lVar1,(byte)lVar1 ^ 0x3f,bVar3);
    }
  }
  for (uVar7 = (ulong)((uint)(game.BP >> 9) & ~(uint)info.BlackPieces & local_48 & 0x7f); uVar7 != 0
      ; uVar7 = uVar7 & uVar7 - 1) {
    lVar1 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    for (bVar3 = '\x06'; bVar3 != '\n'; bVar3 = bVar3 + '\x01') {
      arrayMoveList::create(possibleMoves,'6' - (byte)lVar1,(byte)lVar1 ^ 0x3f,bVar3);
    }
  }
  bVar2 = lastMove.end;
  if (((((uint3)lastMove & 0xf800) == 0x2000 && (lastMove.start != '\0' || bVar2 != 0)) &&
      (((uint3)lastMove & 0xf8) == 0x30)) &&
     ((0x8000000000000000U >> (bVar2 & 0x3f) & game.WP) != 0)) {
    uVar5 = (uint3)lastMove >> 8 & 0xff;
    if (0x20 < uVar5) {
      if ((game.BP & 0x8000000000000000U >> (bVar2 - 1 & 0x3f)) != 0) {
        arrayMoveList::create(possibleMoves,bVar2 - 1,bVar2 | 8,'\v');
      }
      if (0x26 < uVar5) {
        return;
      }
    }
    if ((game.BP & 0x8000000000000000U >> (bVar2 + 1 & 0x3f)) != 0) {
      arrayMoveList::create(possibleMoves,bVar2 + 1,bVar2 | 8,'\v');
      return;
    }
  }
  return;
}

Assistant:

void possibleMovesBPawns(move lastMove, const bitboards game, const extraBitboardsInfo info, arrayMoveList& possibleMoves) {
  // Move forward one
  U64 fw1 = ( (game.BP & ~Rank_2) >> 8 ) & ~(info.BlackPieces | info.WhitePieces);
  constantShiftGenerator(fw1, -8, possibleMoves);

  // Move forward two
  U64 fw2 = ((game.BP & Rank_7) >> 16) & ~(info.BlackPieces | info.WhitePieces) & ~((info.BlackPieces | info.WhitePieces) >> 8);
  constantShiftGenerator(fw2, -16, possibleMoves);

  // Attack
  U64 atL = ((game.BP & ~File_H & ~Rank_2) >> 9) & info.WhitePieces;
  constantShiftGenerator(atL, -9, possibleMoves);

  U64 atR = ((game.BP & ~File_A & ~Rank_2) >> 7) & info.WhitePieces;
  constantShiftGenerator(atR, -7, possibleMoves);

  // Promotion
  U64 pr = ((game.BP & Rank_2) >> 8) & ~(info.BlackPieces | info.WhitePieces);
  while(pr != 0) {
    int i = bitPop(pr);
    for(byte j = 6; j <= 9; j++) {
      possibleMoves.create(i - 8, i, j);
    }
  }

  U64 prL = ((game.BP & Rank_2 & ~File_A) >> 7) & ~(info.BlackPieces) & info.WhitePieces;
  while(prL != 0) {
    int i = bitPop(prL);
    for(byte j = 6; j <= 9; j++) {
      possibleMoves.create(i - 7, i, j);
    }
  }

  U64 prR = ((game.BP & Rank_2 & ~File_H) >> 9) & ~(info.BlackPieces) & info.WhitePieces;
  while(prR != 0) {
    int i = bitPop(prR);
    for(byte j = 6; j <= 9; j++) {
      possibleMoves.create(i - 9, i, j);
    }
  }

  // En passant
	if(!(lastMove.start == 0 && lastMove.end == 0)) { // Was there a last move?
		if(32 <= lastMove.end && lastMove.end <= 39) { // Did it end in our range?
			if(pieceAtSquare(game.WP, lastMove.end)  && 48 <= lastMove.start && lastMove.start <= 55) { // Was it an enemy pawn? Did this pawn move two?
				if(lastMove.end >= 33) // Was it in bounds on the left?
					if(pieceAtSquare(game.BP, lastMove.end - 1)) // Is there a friendly piece on the left side?
						possibleMoves.create(lastMove.end - 1, lastMove.end + 8, 11);
				if(lastMove.end <= 38) // Was it in bounds on the right?
					if(pieceAtSquare(game.BP, lastMove.end + 1)) // Is there a friendly piece on the right side?
						possibleMoves.create(lastMove.end + 1, lastMove.end + 8, 11);
			}
		}
	}
}